

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

void ODDLParser::OpenDDLParser::normalizeBuffer(vector<char,_std::allocator<char>_> *buffer)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  pointer pcVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  vector<char,_std::allocator<char>_> newBuffer;
  vector<char,_std::allocator<char>_> local_48;
  ulong uVar9;
  
  pcVar3 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pcVar4 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (pcVar3 != pcVar4) {
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (char *)0x0;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (char *)0x0;
    uVar8 = 0;
    do {
      pcVar5 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar6 = pcVar5 + uVar8;
      cVar2 = pcVar5[uVar8];
      uVar9 = uVar8;
      if (cVar2 == '/') {
        pcVar1 = pcVar6 + 1;
        if ((pcVar1 == pcVar4) || (*pcVar1 != '*')) {
          if (((pcVar1 == pcVar4) || (*pcVar1 != '/')) ||
             (((byte)((pcVar6[2] & 0xdfU) + 0xbf) < 0x1a && (pcVar6[3] == '/')))) goto LAB_0068b3b6;
          goto LAB_0068b3c0;
        }
        lVar7 = -3 - uVar8;
        for (pcVar6 = pcVar5 + uVar8 + 2;
            ((pcVar6[-1] != '*' || (pcVar6 == pcVar4)) || (*pcVar6 != '/')); pcVar6 = pcVar6 + 1) {
          lVar7 = lVar7 + -1;
        }
        uVar9 = -lVar7;
      }
      else {
LAB_0068b3b6:
        if ((cVar2 == '\n') || (cVar2 == '\r')) {
LAB_0068b3c0:
          if ((((cVar2 == '/') && (pcVar6 + 1 != pcVar4)) && (pcVar6[1] == '/')) &&
             ((0x19 < (byte)((pcVar6[2] & 0xdfU) + 0xbf) || (pcVar6[3] != '/')))) {
            do {
              uVar9 = uVar8 + 1;
              lVar7 = uVar8 + 1;
              uVar8 = uVar9;
            } while (pcVar5[lVar7] != '\n');
          }
        }
        else if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish ==
                 local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&local_48,
                     (iterator)
                     local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,pcVar6);
        }
        else {
          *local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish = cVar2;
          local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      uVar8 = uVar9 + 1;
    } while (uVar8 < (ulong)((long)pcVar4 - (long)pcVar3));
    std::vector<char,_std::allocator<char>_>::operator=(buffer,&local_48);
    if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

const char *OpenDDLParser::getVersion() {
    return Version;
}